

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O1

void * dlwrap_real_dlopen(char *filename,int flag)

{
  void *pvVar1;
  code *UNRECOVERED_JUMPTABLE;
  libwrap *plVar2;
  
  if (dlwrap_real_dlopen::real_dlopen == (fips_dlopen_t)0x0) {
    plVar2 = (libwrap *)0xffffffffffffffff;
    dlwrap_real_dlopen::real_dlopen =
         (fips_dlopen_t)dlwrap_real_dlsym((void *)0xffffffffffffffff,"dlopen");
    if (dlwrap_real_dlopen::real_dlopen == (fips_dlopen_t)0x0) {
      dlwrap_real_dlopen_cold_1();
      if ((libwrap *)0x1050e7 < plVar2 || plVar2 < wrapped_libs) {
        UNRECOVERED_JUMPTABLE = (code *)dlwrap_real_dlsym((void *)0xffffffffffffffff,"__dlclose");
        pvVar1 = (void *)(*UNRECOVERED_JUMPTABLE)(plVar2);
        return pvVar1;
      }
      return (void *)CONCAT71(0x1050,(libwrap *)0x1050e7 < plVar2 || plVar2 < wrapped_libs);
    }
  }
  pvVar1 = (*dlwrap_real_dlopen::real_dlopen)(filename,flag);
  return pvVar1;
}

Assistant:

void *
dlwrap_real_dlopen(const char *filename, int flag)
{
    static fips_dlopen_t real_dlopen = NULL;

    if (!real_dlopen) {
        real_dlopen = (fips_dlopen_t) dlwrap_real_dlsym(RTLD_NEXT, "dlopen");
        if (!real_dlopen) {
            fprintf(stderr, "Error: Failed to find symbol for dlopen.\n");
            exit(1);
        }
    }

    return real_dlopen(filename, flag);
}